

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_5db41::FileSystemRootNode::touch(FileSystemRootNode *this,string *filename)

{
  int iVar1;
  ostream *poVar2;
  allocator local_39;
  string local_38;
  
  iVar1 = utimensat(-100,(filename->_M_dataplus)._M_p,(timespec *)0x0,0);
  if (iVar1 != 0) {
    std::__cxx11::string::string((string *)&local_38,"FileSystem",&local_39);
    poVar2 = GEO::Logger::err(&local_38);
    poVar2 = std::operator<<(poVar2,"Could not touch file:");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return iVar1 == 0;
}

Assistant:

bool touch(const std::string& filename) override {
#ifdef GEO_OS_APPLE
           {
                struct stat buff;
                int rc = stat(filename.c_str(), &buff); 
                if(rc != 0) {  // FABIEN NOT SURE WE GET THE TOUCH
                    Logger::err("FileSystem")
                        << "Could not touch file:"
                        << filename
                        << std::endl;
		    return false;
                }
		return true;
            }
#else
            {
                int rc = utimensat(
                    AT_FDCWD,
                    filename.c_str(),
                    nullptr,
                    0
                );
                if(rc != 0) {
                    Logger::err("FileSystem")
                        << "Could not touch file:"
                        << filename
                        << std::endl;
		    return false;
                }
		return true;
            }
#endif	    
        }